

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::TestCase::matchesTags(TestCase *this,string *tagPattern)

{
  pointer pTVar1;
  bool bVar2;
  pointer this_00;
  bool bVar3;
  TagExpression exp;
  TagExpression local_88;
  TagExpressionParser local_68;
  
  local_68.m_exp = &local_88;
  local_88.m_tagSets.super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>._M_impl.
  super__Vector_impl_data._M_start = (TagSet *)0x0;
  local_88.m_tagSets.super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>._M_impl.
  super__Vector_impl_data._M_finish = (TagSet *)0x0;
  local_88.m_tagSets.super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.m_currentTagSet.m_tags._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68.m_currentTagSet.m_tags._M_t._M_impl.super__Rb_tree_header._M_header;
  local_68.super_TagParser._vptr_TagParser = (_func_int **)&PTR__TagExpressionParser_00165258;
  local_68.m_isNegated = false;
  local_68.m_currentTagSet.m_tags._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68.m_currentTagSet.m_tags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_68.m_currentTagSet.m_tags._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68.m_currentTagSet.m_tags._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68.m_currentTagSet.m_tags._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  TagParser::parse(&local_68.super_TagParser,tagPattern);
  TagExpressionParser::~TagExpressionParser(&local_68);
  pTVar1 = local_88.m_tagSets.super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar3 = local_88.m_tagSets.super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_88.m_tagSets.super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  if (bVar3) {
    this_00 = local_88.m_tagSets.super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      bVar2 = TagSet::matches(this_00,&(this->super_TestCaseInfo).tags);
      if (bVar2) break;
      this_00 = this_00 + 1;
      bVar3 = this_00 != pTVar1;
    } while (bVar3);
  }
  std::vector<Catch::TagSet,_std::allocator<Catch::TagSet>_>::~vector(&local_88.m_tagSets);
  return bVar3;
}

Assistant:

bool TestCase::matchesTags( std::string const& tagPattern ) const {
        TagExpression exp;
        TagExpressionParser( exp ).parse( tagPattern );
        return exp.matches( tags );
    }